

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info * l2_eval_expr_single(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p)

{
  boolean bVar1;
  l2_token *plVar2;
  ulong uVar3;
  char *pcVar4;
  int cols;
  int lines;
  char *pcVar5;
  l2_expr_info local_38;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LOGIC_NOT);
  if (bVar1 == '\0') {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_BIT_NOT);
    if (bVar1 == '\0') {
      bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_SUB);
      if (bVar1 == '\0') {
        l2_eval_expr_atom(__return_storage_ptr__,scope_p);
        return __return_storage_ptr__;
      }
      l2_parse_token_forward();
      plVar2 = l2_parse_token_current();
      l2_eval_expr_single(&local_38,scope_p);
      if (local_38.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        uVar3 = -CONCAT71(local_38.val.integer._1_7_,local_38.val.bool);
      }
      else {
        if (local_38.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_38.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_001096c5;
          lines = plVar2->current_line;
          cols = plVar2->current_col;
          pcVar4 = "-";
          goto LAB_00109675;
        }
        uVar3 = CONCAT71(local_38.val.integer._1_7_,local_38.val.bool) ^ 0x8000000000000000;
      }
      __return_storage_ptr__->val_type = local_38.val_type;
LAB_00109577:
      *(ulong *)&__return_storage_ptr__->val = uVar3;
      return __return_storage_ptr__;
    }
    l2_parse_token_forward();
    plVar2 = l2_parse_token_current();
    l2_eval_expr_single(&local_38,scope_p);
    if (local_38.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      __return_storage_ptr__->val_type = L2_EXPR_VAL_TYPE_INTEGER;
      (__return_storage_ptr__->val).integer =
           ~CONCAT71(local_38.val.integer._1_7_,local_38.val.bool);
      return __return_storage_ptr__;
    }
    if (local_38.val_type != L2_EXPR_VAL_TYPE_REAL) {
      if (local_38.val_type != L2_EXPR_VAL_TYPE_BOOL) {
LAB_001096c5:
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,plVar2->current_line,
                         plVar2->current_col);
      }
      lines = plVar2->current_line;
      cols = plVar2->current_col;
      pcVar4 = "~";
LAB_00109675:
      pcVar5 = "bool";
      goto LAB_001096a5;
    }
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    pcVar4 = "~";
  }
  else {
    l2_parse_token_forward();
    plVar2 = l2_parse_token_current();
    l2_eval_expr_single(&local_38,scope_p);
    if (local_38.val_type == L2_EXPR_VAL_TYPE_BOOL) {
      uVar3 = (ulong)(local_38.val.bool == '\0');
      __return_storage_ptr__->val_type = L2_EXPR_VAL_TYPE_BOOL;
      goto LAB_00109577;
    }
    if (local_38.val_type != L2_EXPR_VAL_TYPE_REAL) {
      if (local_38.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_001096c5;
      lines = plVar2->current_line;
      cols = plVar2->current_col;
      pcVar4 = "!";
      pcVar5 = "integer";
      goto LAB_001096a5;
    }
    lines = plVar2->current_line;
    cols = plVar2->current_col;
    pcVar4 = "!";
  }
  pcVar5 = "real";
LAB_001096a5:
  l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols,pcVar4,
                   pcVar5);
}

Assistant:

l2_expr_info l2_eval_expr_single(l2_scope *scope_p) {
    l2_expr_info res_expr_info, right_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_LOGIC_NOT) /* ! */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        res_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!", "integer");

            case L2_EXPR_VAL_TYPE_BOOL:
                res_expr_info.val.bool = !(right_expr_info.val.bool);
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!", "real");

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);

        }
        return res_expr_info;

    }
    _elif_type (L2_TOKEN_BIT_NOT) /* ~ */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        res_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                res_expr_info.val.integer = ~(right_expr_info.val.integer);
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "~", "bool");

            case L2_EXPR_VAL_TYPE_REAL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "~", "real");

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return res_expr_info;

    }
    _elif_type (L2_TOKEN_SUB) /* - */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                res_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                res_expr_info.val.integer = -(right_expr_info.val.integer);
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "-", "bool");

            case L2_EXPR_VAL_TYPE_REAL:
                res_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                res_expr_info.val.real = -(right_expr_info.val.real);
                break;
                
            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return res_expr_info;

    }
    _else
    {
        return l2_eval_expr_atom(scope_p);
    }
}